

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void sha512_add(sha512 *ctx,uint8_t *data,size_t len)

{
  undefined1 uVar1;
  long lVar2;
  ulong in_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  uint8_t *in_stack_000002a8;
  uint64_t *in_stack_000002b0;
  ulong local_18;
  undefined1 *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 200) != 0) {
    for (; *(ulong *)(in_RDI + 200) < 0x80 && local_18 != 0; local_18 = local_18 - 1) {
      uVar1 = *local_10;
      lVar2 = *(long *)(in_RDI + 200);
      *(long *)(in_RDI + 200) = lVar2 + 1;
      *(undefined1 *)(in_RDI + 0x48 + lVar2) = uVar1;
      local_10 = local_10 + 1;
    }
    if (*(ulong *)(in_RDI + 200) < 0x80) {
      return;
    }
    compress(in_stack_000002b0,in_stack_000002a8);
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
  }
  for (; 0x7f < local_18; local_18 = local_18 - 0x80) {
    compress(in_stack_000002b0,in_stack_000002a8);
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
    local_10 = local_10 + 0x80;
  }
  memcpy((void *)(in_RDI + 0x48),local_10,local_18);
  *(ulong *)(in_RDI + 200) = local_18;
  return;
}

Assistant:

void
sha512_add(struct sha512 *ctx, const uint8_t *data, size_t len)
{
	if (ctx->fill > 0) {
		/* fill internal buffer up and compress */
		while (ctx->fill < SHA512_BLOCK_SIZE && len > 0) {
			ctx->buffer[ctx->fill++] = *data++;
			len--;
		}
		if (ctx->fill < SHA512_BLOCK_SIZE)
			return;

		compress(ctx->state, ctx->buffer);
		ctx->count++;
	}

	/* ctx->fill is now zero */

	while (len >= SHA512_BLOCK_SIZE) {
		compress(ctx->state, data);
		ctx->count++;
		
		data += SHA512_BLOCK_SIZE;
		len -= SHA512_BLOCK_SIZE;
	}

	/* save rest for next time */
	memcpy(ctx->buffer, data, len);
	ctx->fill = len;
}